

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O1

void mpiabi_win_allocate_shared_
               (MPIABI_Fint *size,MPIABI_Fint *disp_unit,MPIABI_Fint *info,MPIABI_Fint *comm,
               void *baseptr,MPIABI_Fint *win,MPIABI_Fint *ierror)

{
  mpi_win_allocate_shared_();
  return;
}

Assistant:

void mpiabi_win_allocate_shared_(
  const MPIABI_Fint * size,
  const MPIABI_Fint * disp_unit,
  const MPIABI_Fint * info,
  const MPIABI_Fint * comm,
  void * baseptr,
  MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_win_allocate_shared_(
    size,
    disp_unit,
    info,
    comm,
    baseptr,
    win,
    ierror
  );
}